

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerBailOnNotPolymorphicInlinee(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  
  if ((instr->field_0x38 & 0x10) != 0) {
    BVar4 = IR::Instr::GetBailOutKind(instr);
    if (BVar4 == BailOutOnFailedPolymorphicInlineTypeCheck) goto LAB_0055dc14;
    BVar4 = IR::Instr::GetBailOutKind(instr);
    if (BVar4 == BailOutOnPolymorphicInlineFunction) goto LAB_0055dc14;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x3142,
                     "(instr->HasBailOutInfo() && (instr->GetBailOutKind() == IR::BailOutOnFailedPolymorphicInlineTypeCheck || instr->GetBailOutKind() == IR::BailOutOnPolymorphicInlineFunction))"
                     ,
                     "instr->HasBailOutInfo() && (instr->GetBailOutKind() == IR::BailOutOnFailedPolymorphicInlineTypeCheck || instr->GetBailOutKind() == IR::BailOutOnPolymorphicInlineFunction)"
                    );
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_0055dc14:
  pIVar1 = instr->m_prev;
  GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotPolymorphicInlinee(IR::Instr * instr)
{
    Assert(instr->HasBailOutInfo() && (instr->GetBailOutKind() == IR::BailOutOnFailedPolymorphicInlineTypeCheck || instr->GetBailOutKind() == IR::BailOutOnPolymorphicInlineFunction));
    IR::Instr* instrPrev = instr->m_prev;

    this->GenerateBailOut(instr, nullptr, nullptr);

    return instrPrev;
}